

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  ImSpan<signed_char> *this;
  ImVec2 *pIVar1;
  float *pfVar2;
  byte bVar3;
  char cVar4;
  ImGuiTable *pIVar5;
  ImGuiTableColumnIdx IVar6;
  uint uVar7;
  char *pcVar8;
  ImGuiTableColumn *pIVar9;
  ImGuiTableColumn *pIVar10;
  char *pcVar11;
  int column_n;
  int i;
  int i_00;
  ImGuiTableColumnIdx IVar12;
  
  pIVar5 = GImGui->CurrentTable;
  if (pIVar5 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableSetupColumn() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c2,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (pIVar5->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false && \"Need to call TableSetupColumn() before first row!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c3,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (0x3f < (uint)columns) {
    __assert_fail("columns >= 0 && columns < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c4,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if ((uint)rows < 0x80) {
    i = 0;
    uVar7 = 0;
    if ((((uint)pIVar5->Flags >> 0x18 & 1) != 0) &&
       (uVar7 = pIVar5->ColumnsCount, columns < pIVar5->ColumnsCount)) {
      uVar7 = columns;
    }
    IVar6 = (ImGuiTableColumnIdx)uVar7;
    pIVar5->FreezeColumnsRequest = IVar6;
    pIVar1 = &pIVar5->InnerWindow->Scroll;
    IVar12 = '\0';
    if (pIVar1->x != 0.0) {
      IVar12 = IVar6;
    }
    if (NAN(pIVar1->x)) {
      IVar12 = IVar6;
    }
    pIVar5->FreezeColumnsCount = IVar12;
    if (((uint)pIVar5->Flags >> 0x19 & 1) == 0) {
      rows = 0;
    }
    IVar6 = (ImGuiTableColumnIdx)rows;
    pIVar5->FreezeRowsRequest = IVar6;
    pfVar2 = &(pIVar5->InnerWindow->Scroll).y;
    IVar12 = '\0';
    if (*pfVar2 != 0.0) {
      IVar12 = IVar6;
    }
    if (NAN(*pfVar2)) {
      IVar12 = IVar6;
    }
    pIVar5->FreezeRowsCount = IVar12;
    pIVar5->IsUnfrozenRows = IVar12 == '\0';
    this = &pIVar5->DisplayOrderToIndex;
    for (; i < (char)uVar7; i = i + 1) {
      pcVar8 = ImSpan<signed_char>::operator[](this,i);
      i_00 = (int)*pcVar8;
      bVar3 = pIVar5->FreezeColumnsRequest;
      if ((char)bVar3 <= *pcVar8 && i != i_00) {
        pcVar8 = ImSpan<signed_char>::operator[](this,i_00);
        pIVar9 = ImSpan<ImGuiTableColumn>::operator[](&pIVar5->Columns,(int)*pcVar8);
        pcVar8 = ImSpan<signed_char>::operator[](this,i);
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&pIVar5->Columns,(int)*pcVar8);
        IVar12 = pIVar9->DisplayOrder;
        pIVar9->DisplayOrder = pIVar10->DisplayOrder;
        pIVar10->DisplayOrder = IVar12;
        pcVar8 = ImSpan<signed_char>::operator[](this,i_00);
        pcVar11 = ImSpan<signed_char>::operator[](this,i);
        cVar4 = *pcVar8;
        *pcVar8 = *pcVar11;
        *pcVar11 = cVar4;
        bVar3 = pIVar5->FreezeColumnsRequest;
      }
      uVar7 = (uint)bVar3;
    }
    return;
  }
  __assert_fail("rows >= 0 && rows < 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                ,0x5c5,"void ImGui::TableSetupScrollFreeze(int, int)");
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)ImMin(columns, table->ColumnsCount) : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b

    // Ensure frozen columns are ordered in their section. We still allow multiple frozen columns to be reordered.
    // FIXME-TABLE: This work for preserving 2143 into 21|43. How about 4321 turning into 21|43? (preserve relative order in each section)
    for (int column_n = 0; column_n < table->FreezeColumnsRequest; column_n++)
    {
        int order_n = table->DisplayOrderToIndex[column_n];
        if (order_n != column_n && order_n >= table->FreezeColumnsRequest)
        {
            ImSwap(table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder, table->Columns[table->DisplayOrderToIndex[column_n]].DisplayOrder);
            ImSwap(table->DisplayOrderToIndex[order_n], table->DisplayOrderToIndex[column_n]);
        }
    }
}